

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeHeap.cpp
# Opt level: O2

void __thiscall wasm::SafeHeap::addStoreFunc(SafeHeap *this,Store style,Module *module)

{
  ExpressionList *this_00;
  MixedArena *this_01;
  Type addressType;
  char *pcVar1;
  Type TVar2;
  Block *pBVar3;
  Function *pFVar4;
  LocalGet *pLVar5;
  LocalGet *right;
  Binary *value;
  LocalSet *item;
  Expression *pEVar6;
  Store *this_02;
  BinaryOp op;
  Name name;
  initializer_list<wasm::Type> types;
  Signature sig;
  initializer_list<wasm::Type> __l;
  Name name_00;
  Type local_88;
  Type local_80;
  HeapType local_78;
  Block *local_70;
  SafeHeap *local_68;
  Type local_60;
  Builder builder;
  _Head_base<0UL,_wasm::Function_*,_false> local_48;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> func;
  allocator_type local_31;
  
  name_00 = getStoreName(&style);
  pFVar4 = Module::getFunctionOrNull(module,name_00);
  if (pFVar4 == (Function *)0x0) {
    local_68 = this;
    func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         Module::getMemory(module,style.memory);
    addressType.id =
         ((Type *)((long)func._M_t.
                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                         .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x50))->id;
    types._M_len = 3;
    types._M_array = &stack0xffffffffffffffa0;
    local_60.id = addressType.id;
    builder.wasm = (Module *)addressType.id;
    wasm::Type::Type(&local_88,types);
    sig.results.id = 0;
    sig.params.id = local_88.id;
    HeapType::HeapType(&local_78,sig);
    __l._M_len = 1;
    __l._M_array = &local_80;
    local_80.id = addressType.id;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&stack0xffffffffffffffa0,__l,
               &local_31);
    name.super_IString.str._M_str = name_00.super_IString.str._M_len;
    name.super_IString.str._M_len = (size_t)&local_48;
    Builder::makeFunction
              (name,(HeapType)name_00.super_IString.str._M_str,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_78.id,
               (Expression *)&stack0xffffffffffffffa0);
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
              ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)&stack0xffffffffffffffa0);
    this_01 = &module->allocator;
    local_60.id = (uintptr_t)module;
    local_70 = MixedArena::alloc<wasm::Block>(this_01);
    op = AddInt64;
    if (addressType.id != 3) {
      op = AddInt32;
    }
    pLVar5 = MixedArena::alloc<wasm::LocalGet>(this_01);
    pLVar5->index = 0;
    (pLVar5->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
         addressType.id;
    right = MixedArena::alloc<wasm::LocalGet>(this_01);
    right->index = 1;
    (right->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
         addressType.id;
    value = Builder::makeBinary((Builder *)&stack0xffffffffffffffa0,op,(Expression *)pLVar5,
                                (Expression *)right);
    item = Builder::makeLocalSet((Builder *)&stack0xffffffffffffffa0,3,(Expression *)value);
    this_00 = &local_70->list;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_00->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)item);
    pEVar6 = makeBoundsCheck(local_68,style.valueType,(Builder *)&stack0xffffffffffffffa0,0,3,
                             (uint)style.bytes,module,addressType,addressType.id == 3,
                             (IString)*(IString *)
                                       func._M_t.
                                       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)
    ;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_00->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               pEVar6);
    if (1 < style.align.addr) {
      pEVar6 = makeAlignCheck(local_68,style.align,(Builder *)&stack0xffffffffffffffa0,3,module,
                              (IString)*(IString *)
                                        func._M_t.
                                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl
                             );
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_00->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar6)
      ;
    }
    this_02 = MixedArena::alloc<wasm::Store>(this_01);
    Store::operator=(this_02,&style);
    pcVar1 = *(char **)((long)func._M_t.
                              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                              .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 8);
    (this_02->memory).super_IString.str._M_len =
         *(size_t *)
          func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
          .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
          super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    (this_02->memory).super_IString.str._M_str = pcVar1;
    pLVar5 = MixedArena::alloc<wasm::LocalGet>((MixedArena *)(local_60.id + 0x200));
    TVar2 = style.valueType;
    pLVar5->index = 3;
    (pLVar5->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
         addressType.id;
    this_02->ptr = (Expression *)pLVar5;
    pLVar5 = MixedArena::alloc<wasm::LocalGet>((MixedArena *)(local_60.id + 0x200));
    pLVar5->index = 2;
    (pLVar5->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = TVar2.id;
    this_02->value = (Expression *)pLVar5;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_00->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)this_02);
    pBVar3 = local_70;
    Block::finalize(local_70,(optional<wasm::Type>)(ZEXT816(1) << 0x40),Unknown);
    (local_48._M_head_impl)->body = (Expression *)pBVar3;
    Module::addFunction(module,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                               &local_48);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
              ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&local_48);
  }
  return;
}

Assistant:

void addStoreFunc(Store style, Module* module) {
    auto name = getStoreName(&style);
    if (module->getFunctionOrNull(name)) {
      return;
    }
    auto memory = module->getMemory(style.memory);
    auto addressType = memory->addressType;
    bool is64 = memory->is64();
    // pointer, offset, value
    auto funcSig =
      Signature({addressType, addressType, style.valueType}, Type::none);
    auto func = Builder::makeFunction(name, funcSig, {addressType});
    Builder builder(*module);
    auto* block = builder.makeBlock();
    block->list.push_back(builder.makeLocalSet(
      3,
      builder.makeBinary(is64 ? AddInt64 : AddInt32,
                         builder.makeLocalGet(0, addressType),
                         builder.makeLocalGet(1, addressType))));
    // check for reading past valid memory: if pointer + offset + bytes
    block->list.push_back(makeBoundsCheck(style.valueType,
                                          builder,
                                          0,
                                          3,
                                          style.bytes,
                                          module,
                                          addressType,
                                          is64,
                                          memory->name));
    // check proper alignment
    if (style.align > 1) {
      block->list.push_back(
        makeAlignCheck(style.align, builder, 3, module, memory->name));
    }
    // do the store
    auto* store = module->allocator.alloc<Store>();
    *store = style; // basically the same as the template we are given!
    store->memory = memory->name;
    store->ptr = builder.makeLocalGet(3, addressType);
    store->value = builder.makeLocalGet(2, style.valueType);
    block->list.push_back(store);
    block->finalize(Type::none);
    func->body = block;
    module->addFunction(std::move(func));
  }